

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallbackFederate.cpp
# Opt level: O2

void __thiscall
helics::CallbackFederate::CallbackFederate(CallbackFederate *this,CallbackFederate *param_1)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  Federate::Federate((Federate *)&(this->super_CombinationFederate).super_ValueFederate.field_0x98,
                     (Federate *)
                     ((long)&(param_1->super_CombinationFederate).super_ValueFederate.
                             _vptr_ValueFederate +
                     (long)(param_1->super_CombinationFederate).super_ValueFederate.
                           _vptr_ValueFederate[-3]));
  helics::CombinationFederate::CombinationFederate
            (&this->super_CombinationFederate,&PTR_construction_vtable_24__004bcce8,
             &param_1->super_CombinationFederate);
  (this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate = (_func_int **)0x4bcb38
  ;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x98 = 0x4bcc60;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x10 = 0x4bcb98;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x28 = 0;
  uVar1 = *(undefined8 *)&(param_1->super_CombinationFederate).super_ValueFederate.field_0x20;
  uVar2 = *(undefined8 *)&(param_1->super_CombinationFederate).super_ValueFederate.field_0x28;
  *(undefined8 *)&(param_1->super_CombinationFederate).super_ValueFederate.field_0x28 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x20 = uVar1;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x28 = uVar2;
  *(undefined8 *)&(param_1->super_CombinationFederate).super_ValueFederate.field_0x20 = 0;
  (this->super_CombinationFederate).super_ValueFederate.field_0x30 =
       (param_1->super_CombinationFederate).super_ValueFederate.field_0x30;
  std::function<helics::IterationRequest_()>::function
            ((function<helics::IterationRequest_()> *)
             &(this->super_CombinationFederate).super_ValueFederate.field_0x38,
             (function<helics::IterationRequest_()> *)
             &(param_1->super_CombinationFederate).super_ValueFederate.field_0x38);
  std::
  function<std::pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest>_(helics::iteration_time)>
  ::function((function<std::pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest>_(helics::iteration_time)>
              *)&(this->super_CombinationFederate).super_ValueFederate.field_0x58,
             (function<std::pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest>_(helics::iteration_time)>
              *)&(param_1->super_CombinationFederate).super_ValueFederate.field_0x58);
  std::function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
  ::function((function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
              *)&(this->super_CombinationFederate).super_ValueFederate.field_0x78,
             (function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
              *)&(param_1->super_CombinationFederate).super_ValueFederate.field_0x78);
  return;
}

Assistant:

CallbackFederate::CallbackFederate(CallbackFederate&&) noexcept = default;